

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void EV_StartLightFading(int tag,int value,int tics)

{
  uint uVar1;
  DSectorEffect *pDVar2;
  DGlow2 *this;
  int iVar3;
  int iVar4;
  sector_t_conflict *psVar5;
  FSectorTagIterator it;
  
  if (tag == 0) {
    it.start = 0;
  }
  else {
    it.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  iVar3 = 0x7fff;
  if (value < 0x7fff) {
    iVar3 = value;
  }
  it.searchtag = tag;
  iVar4 = -0x8000;
  if (-0x8000 < iVar3) {
    iVar4 = iVar3;
  }
  while (uVar1 = FSectorTagIterator::Next(&it), psVar5 = sectors, -1 < (int)uVar1) {
    pDVar2 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&sectors[uVar1].lightingdata);
    if (pDVar2 == (DSectorEffect *)0x0) {
      psVar5 = psVar5 + uVar1;
      if (tics < 1) {
        psVar5->lightlevel = (short)iVar4;
      }
      else if (psVar5->lightlevel != value) {
        this = (DGlow2 *)DObject::operator_new(0x58);
        DGlow2::DGlow2(this,(sector_t *)psVar5,(int)psVar5->lightlevel,value,tics,true);
      }
    }
  }
  return;
}

Assistant:

void EV_StartLightFading (int tag, int value, int tics)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;

		if (tics <= 0)
		{
			sec->SetLightLevel(value);
		}
		else
		{
			// No need to fade if lightlevel is already at desired value.
			if (sec->lightlevel == value)
				continue;

			new DGlow2 (sec, sec->lightlevel, value, tics, true);
		}
	}
}